

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_sound.cpp
# Opt level: O0

void I_CloseSound(void)

{
  uint uVar1;
  sfxinfo_t *sfx;
  uint local_c;
  uint i;
  
  local_c = 0;
  while( true ) {
    uVar1 = TArray<sfxinfo_t,_sfxinfo_t>::Size(&S_sfx);
    if (uVar1 <= local_c) break;
    sfx = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)local_c);
    S_UnloadSound(sfx);
    local_c = local_c + 1;
  }
  if (GSnd != (SoundRenderer *)0x0) {
    (*GSnd->_vptr_SoundRenderer[1])();
  }
  GSnd = (SoundRenderer *)0x0;
  return;
}

Assistant:

void I_CloseSound ()
{
	// Free all loaded samples
	for (unsigned i = 0; i < S_sfx.Size(); i++)
	{
		S_UnloadSound(&S_sfx[i]);
	}

	delete GSnd;
	GSnd = NULL;
}